

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O2

PBuffer __thiscall DataSourceCustom::get_sound(DataSourceCustom *this,size_t index)

{
  ConfigFile *this_00;
  ResInfo *pRVar1;
  ostream *poVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  PBuffer PVar4;
  allocator<char> local_229;
  string local_228;
  string fpath;
  string local_1e8;
  string file_name;
  stringstream stream;
  undefined1 local_198 [376];
  
  pRVar1 = get_info((DataSourceCustom *)index,AssetSound);
  if (pRVar1 == (ResInfo *)0x0) {
    (this->super_DataSourceBase).super_Source._vptr_Source = (_func_int **)0x0;
    (this->super_DataSourceBase).path._M_dataplus._M_p = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar2 = std::operator<<(local_198,0x30);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    this_00 = (pRVar1->meta).super___shared_ptr<ConfigFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"path",&local_229);
    std::__cxx11::stringbuf::str();
    ConfigFile::value(&file_name,this_00,&fpath,&local_228,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&fpath);
    std::operator+(&local_228,&pRVar1->path,"/");
    std::operator+(&fpath,&local_228,&file_name);
    std::__cxx11::string::~string((string *)&local_228);
    std::make_shared<Buffer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string((string *)&fpath);
    std::__cxx11::string::~string((string *)&file_name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar4.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceCustom::get_sound(size_t index) {
  ResInfo *info = get_info(Data::AssetSound);
  if (info == nullptr) {
    return nullptr;
  }

  std::stringstream stream;
  stream << std::setfill('0') << std::setw(3) << index;
  std::string file_name = info->meta->value(stream.str(), "path", stream.str());
  std::string fpath = info->path + "/" + file_name;

  try {
    PBuffer file = std::make_shared<Buffer>(fpath);
    return file;
  } catch (...) {
    return nullptr;
  }
}